

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O0

void __thiscall Adjacency_Subgraph_degree_Test::TestBody(Adjacency_Subgraph_degree_Test *this)

{
  allocator<unsigned_long> *this_00;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_3e0;
  Message local_3d8;
  int local_3cc;
  size_t local_3c8;
  size_t local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_9;
  Message local_3a0;
  int local_394;
  size_t local_390;
  size_t local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_8;
  Message local_368;
  int local_35c;
  size_t local_358;
  size_t local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_7;
  Message local_330;
  int local_324;
  size_t local_320;
  size_t local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_6;
  Message local_2f8;
  int local_2ec;
  size_t local_2e8;
  size_t local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_5;
  unsigned_long local_2c0;
  iterator local_2b8;
  size_type local_2b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2a8;
  Adjacency_Subgraph local_290;
  AssertHelper local_228;
  Message local_220;
  int local_214;
  size_t local_210;
  size_t local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_4;
  Message local_1e8;
  int local_1dc;
  size_t local_1d8;
  size_t local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_3;
  Message local_1b0;
  int local_1a4;
  size_t local_1a0;
  size_t local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_2;
  Message local_178;
  int local_16c;
  size_t local_168;
  size_t local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_1;
  Message local_140;
  int local_134;
  size_t local_130;
  size_t local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  allocator<unsigned_long> local_f9;
  unsigned_long local_f8 [5];
  iterator local_d0;
  size_type local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  undefined1 local_a8 [8];
  Adjacency_Subgraph subgraph;
  Adjacency_Graph<false> graph;
  Adjacency_Subgraph_degree_Test *this_local;
  
  Disa::create_graph_structured<false>
            ((Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,3);
  local_f8[2] = 4;
  local_f8[3] = 5;
  local_f8[0] = 1;
  local_f8[1] = 3;
  local_f8[4] = 7;
  local_d0 = local_f8;
  local_c8 = 5;
  std::allocator<unsigned_long>::allocator(&local_f9);
  __l_00._M_len = local_c8;
  __l_00._M_array = local_d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c0,__l_00,&local_f9);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            ((Adjacency_Subgraph *)local_a8,
             (Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_c0,0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_c0);
  std::allocator<unsigned_long>::~allocator(&local_f9);
  local_130 = 0;
  local_128 = Disa::Adjacency_Subgraph::degree((Adjacency_Subgraph *)local_a8,&local_130);
  local_134 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_120,"subgraph.degree(0)","1",&local_128,&local_134);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_168 = 1;
  local_160 = Disa::Adjacency_Subgraph::degree((Adjacency_Subgraph *)local_a8,&local_168);
  local_16c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_158,"subgraph.degree(1)","1",&local_160,&local_16c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_1a0 = 2;
  local_198 = Disa::Adjacency_Subgraph::degree((Adjacency_Subgraph *)local_a8,&local_1a0);
  local_1a4 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_190,"subgraph.degree(2)","4",&local_198,&local_1a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x12a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1d8 = 3;
  local_1d0 = Disa::Adjacency_Subgraph::degree((Adjacency_Subgraph *)local_a8,&local_1d8);
  local_1dc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1c8,"subgraph.degree(3)","1",&local_1d0,&local_1dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,299,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_210 = 4;
  local_208 = Disa::Adjacency_Subgraph::degree((Adjacency_Subgraph *)local_a8,&local_210);
  local_214 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_200,"subgraph.degree(4)","1",&local_208,&local_214);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,300,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_2c0 = 4;
  local_2b8 = &local_2c0;
  local_2b0 = 1;
  this_00 = (allocator<unsigned_long> *)
            ((long)&gtest_ar_5.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<unsigned_long>::allocator(this_00);
  __l._M_len = local_2b0;
  __l._M_array = local_2b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2a8,__l,this_00);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            (&local_290,
             (Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_2a8,1);
  Disa::Adjacency_Subgraph::operator=((Adjacency_Subgraph *)local_a8,&local_290);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_290);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2a8);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&gtest_ar_5.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_2e8 = 0;
  local_2e0 = Disa::Adjacency_Subgraph::degree((Adjacency_Subgraph *)local_a8,&local_2e8);
  local_2ec = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2d8,"subgraph.degree(0)","4",&local_2e0,&local_2ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  local_320 = 1;
  local_318 = Disa::Adjacency_Subgraph::degree((Adjacency_Subgraph *)local_a8,&local_320);
  local_324 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_310,"subgraph.degree(1)","1",&local_318,&local_324);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_358 = 2;
  local_350 = Disa::Adjacency_Subgraph::degree((Adjacency_Subgraph *)local_a8,&local_358);
  local_35c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_348,"subgraph.degree(2)","1",&local_350,&local_35c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x132,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  local_390 = 3;
  local_388 = Disa::Adjacency_Subgraph::degree((Adjacency_Subgraph *)local_a8,&local_390);
  local_394 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_380,"subgraph.degree(3)","1",&local_388,&local_394);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x133,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  local_3c8 = 4;
  local_3c0 = Disa::Adjacency_Subgraph::degree((Adjacency_Subgraph *)local_a8,&local_3c8);
  local_3cc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3b8,"subgraph.degree(4)","1",&local_3c0,&local_3cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x134,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_a8);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph
            ((Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, degree) {
  Adjacency_Graph<false> graph = create_graph_structured<false>(3);

  // Test degree on primary subgraph.
  Adjacency_Subgraph subgraph(graph, {1, 3, 4, 5, 7});
  EXPECT_EQ(subgraph.degree(0), 1);
  EXPECT_EQ(subgraph.degree(1), 1);
  EXPECT_EQ(subgraph.degree(2), 4);
  EXPECT_EQ(subgraph.degree(3), 1);
  EXPECT_EQ(subgraph.degree(4), 1);

  // Test degree on both level and primary parts of the subgraph.
  subgraph = Adjacency_Subgraph(graph, {4}, 1);
  EXPECT_EQ(subgraph.degree(0), 4);
  EXPECT_EQ(subgraph.degree(1), 1);
  EXPECT_EQ(subgraph.degree(2), 1);
  EXPECT_EQ(subgraph.degree(3), 1);
  EXPECT_EQ(subgraph.degree(4), 1);
}